

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O2

char * mfload(FILE *fp,char *fn,size_t *size,int binary)

{
  bool bVar1;
  int iVar2;
  char *__ptr;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  ulong __size;
  ulong unaff_R15;
  stat sb;
  
  bVar1 = true;
  lVar5 = 0x2000;
  if ((fn == (char *)0x0) || (iVar2 = stat(fn,(stat *)&sb), unaff_R15 = sb.st_size, iVar2 == -1)) {
    __ptr = (char *)0x0;
    __size = 0;
  }
  else {
    __ptr = (char *)malloc(sb.st_size);
    lVar5 = (long)(int)sb.st_size;
    bVar1 = false;
    __size = sb.st_size;
  }
  uVar4 = 0;
  do {
    if (__size < uVar4 + lVar5) {
      __size = __size + lVar5;
      __ptr = (char *)realloc(__ptr,__size);
    }
    sVar3 = fread(__ptr + uVar4,1,__size - uVar4,(FILE *)fp);
    uVar4 = uVar4 + sVar3;
    iVar2 = feof((FILE *)fp);
  } while ((iVar2 == 0) && (uVar4 < unaff_R15 || bVar1));
  *size = uVar4;
  return __ptr;
}

Assistant:

static char *mfload(FILE *fp, const char *fn, size_t *size, int binary) {
    struct stat sb;
    char *data = NULL;
    size_t allocated = 0, used = 0;
    int bufsize = 8192;

#ifdef _WIN32
    if (binary)
	_setmode(_fileno(fp), _O_BINARY);
    else 
	_setmode(_fileno(fp), _O_TEXT);
#endif

    if (fn && -1 != stat(fn, &sb)) {
	data = malloc(allocated = sb.st_size);
	bufsize = sb.st_size;
    } else {
	fn = NULL;
    }

    do {
	size_t len;
	if (used + bufsize > allocated) {
	    allocated += bufsize;
	    data = realloc(data, allocated);
	}
	len = fread(data + used, 1, allocated - used, fp);
	if (len > 0)
	    used += len;
    } while (!feof(fp) && (fn == NULL || used < sb.st_size));

    *size = used;

    return data;
}